

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress1X1_usingDTable_internal_bmi2
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable)

{
  undefined1 *puVar1;
  byte bVar2;
  ushort uVar3;
  ulong *puVar4;
  char cVar5;
  uint uVar6;
  ulong uVar7;
  ulong *puVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  bool bVar13;
  
  if (cSrcSize == 0) {
    cSrcSize = 0xffffffffffffffb8;
    uVar10 = 0;
    uVar7 = 0;
    puVar8 = (ulong *)0x0;
    cSrc = (ulong *)0x0;
    puVar4 = (ulong *)0x0;
  }
  else {
    puVar4 = (ulong *)((long)cSrc + 8);
    if (cSrcSize < 8) {
      uVar7 = (ulong)*cSrc;
      switch(cSrcSize) {
      case 7:
        uVar7 = uVar7 | (ulong)*(byte *)((long)cSrc + 6) << 0x30;
      case 6:
        uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        uVar7 = uVar7 + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000;
      case 3:
        uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        uVar7 = uVar7 + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
        uVar9 = 0x1f;
        if (bVar2 != 0) {
          for (; bVar2 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        if (bVar2 == 0) {
          cSrcSize = 0xffffffffffffffec;
          uVar9 = 0;
        }
        else {
          uVar9 = ~uVar9 + (int)cSrcSize * -8 + 0x49;
        }
        uVar10 = (ulong)uVar9;
        puVar8 = (ulong *)cSrc;
      }
    }
    else {
      puVar8 = (ulong *)((long)cSrc + (cSrcSize - 8));
      uVar7 = *puVar8;
      bVar2 = *(byte *)((long)cSrc + (cSrcSize - 1));
      uVar9 = 0x1f;
      if (bVar2 != 0) {
        for (; bVar2 >> uVar9 == 0; uVar9 = uVar9 - 1) {
        }
      }
      uVar9 = ~uVar9 + 9;
      if (bVar2 == 0) {
        uVar9 = 0;
      }
      uVar10 = (ulong)uVar9;
      cSrcSize = cSrcSize | -(ulong)(bVar2 == 0);
    }
  }
  if (0xffffffffffffff88 < cSrcSize) {
    return cSrcSize;
  }
  puVar1 = (undefined1 *)((long)dst + dstSize);
  uVar3 = *(ushort *)((long)DTable + 2);
  uVar9 = -(uint)uVar3 & 0x3f;
  do {
    uVar12 = (uint)uVar10;
    if (uVar12 < 0x41) {
      if (puVar8 < puVar4) {
        if (puVar8 == (ulong *)cSrc) goto LAB_00176542;
        bVar13 = cSrc <= (ulong *)((long)puVar8 - (uVar10 >> 3));
        uVar6 = (int)puVar8 - (int)cSrc;
        if (bVar13) {
          uVar6 = (uint)(uVar10 >> 3);
        }
        uVar12 = uVar12 + uVar6 * -8;
      }
      else {
        uVar6 = (uint)(uVar10 >> 3);
        uVar12 = uVar12 & 7;
        bVar13 = true;
      }
      uVar10 = (ulong)uVar12;
      puVar8 = (ulong *)((long)puVar8 - (ulong)uVar6);
      uVar7 = *puVar8;
    }
    else {
LAB_00176542:
      bVar13 = false;
    }
    cVar5 = (char)uVar3;
    uVar12 = (uint)uVar10;
    if ((puVar1 + -3 <= dst) || (!bVar13)) {
      if (puVar1 <= dst) goto LAB_0017665b;
      if (cVar5 != '\0') {
        do {
          uVar11 = (uVar7 << (uVar10 & 0x3f)) >> uVar9;
          uVar12 = (uint)*(byte *)((long)DTable + uVar11 * 2 + 5) + (int)uVar10;
          *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
          dst = (void *)((long)dst + 1);
          uVar10 = (ulong)uVar12;
        } while (dst < puVar1);
LAB_0017665b:
        if (uVar12 != 0x40) {
          dstSize = 0xffffffffffffffec;
        }
        if (puVar8 == (ulong *)cSrc) {
          return dstSize;
        }
        return 0xffffffffffffffec;
      }
LAB_0017667f:
      __assert_fail("nbBits >= 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x680,"size_t BIT_lookBitsFast(const BIT_DStream_t *, U32)");
    }
    if (cVar5 == '\0') goto LAB_0017667f;
    uVar10 = (uVar7 << (uVar10 & 0x3f)) >> uVar9;
    uVar12 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar12;
    *(undefined1 *)dst = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    uVar10 = (uVar7 << ((ulong)uVar12 & 0x3f)) >> uVar9;
    uVar12 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar12;
    *(undefined1 *)((long)dst + 1) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    uVar10 = (uVar7 << ((ulong)uVar12 & 0x3f)) >> uVar9;
    uVar12 = *(byte *)((long)DTable + uVar10 * 2 + 5) + uVar12;
    *(undefined1 *)((long)dst + 2) = *(undefined1 *)((long)DTable + uVar10 * 2 + 4);
    uVar11 = (uVar7 << ((ulong)uVar12 & 0x3f)) >> uVar9;
    uVar10 = (ulong)(*(byte *)((long)DTable + uVar11 * 2 + 5) + uVar12);
    *(undefined1 *)((long)dst + 3) = *(undefined1 *)((long)DTable + uVar11 * 2 + 4);
    dst = (void *)((long)dst + 4);
  } while( true );
}

Assistant:

MEM_STATIC size_t BIT_initDStream(BIT_DStream_t* bitD, const void* srcBuffer, size_t srcSize)
{
    if (srcSize < 1) { memset(bitD, 0, sizeof(*bitD)); return ERROR(srcSize_wrong); }

    bitD->start = (const char*)srcBuffer;
    bitD->limitPtr = bitD->start + sizeof(bitD->bitContainer);

    if (srcSize >=  sizeof(bitD->bitContainer)) {  /* normal case */
        bitD->ptr   = (const char*)srcBuffer + srcSize - sizeof(bitD->bitContainer);
        bitD->bitContainer = MEM_readLEST(bitD->ptr);
        { BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
          bitD->bitsConsumed = lastByte ? 8 - BIT_highbit32(lastByte) : 0;  /* ensures bitsConsumed is always set */
          if (lastByte == 0) return ERROR(GENERIC); /* endMark not present */ }
    } else {
        bitD->ptr   = bitD->start;
        bitD->bitContainer = *(const BYTE*)(bitD->start);
        switch(srcSize)
        {
        case 7: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[6]) << (sizeof(bitD->bitContainer)*8 - 16);
                /* fall-through */

        case 6: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[5]) << (sizeof(bitD->bitContainer)*8 - 24);
                /* fall-through */

        case 5: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[4]) << (sizeof(bitD->bitContainer)*8 - 32);
                /* fall-through */

        case 4: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[3]) << 24;
                /* fall-through */

        case 3: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[2]) << 16;
                /* fall-through */

        case 2: bitD->bitContainer += (size_t)(((const BYTE*)(srcBuffer))[1]) <<  8;
                /* fall-through */

        default: break;
        }
        {   BYTE const lastByte = ((const BYTE*)srcBuffer)[srcSize-1];
            bitD->bitsConsumed = lastByte ? 8 - BIT_highbit32(lastByte) : 0;
            if (lastByte == 0) return ERROR(corruption_detected);  /* endMark not present */
        }
        bitD->bitsConsumed += (U32)(sizeof(bitD->bitContainer) - srcSize)*8;
    }

    return srcSize;
}